

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe34At0(uint8_t *buf)

{
  return (ulong)(*(ushort *)(buf + 3) & 0x3ff) << 0x18 | (ulong)buf[2] << 0x10 | (ulong)buf[1] << 8
         | (ulong)*buf;
}

Assistant:

std::uint64_t readFlUIntLe34At0(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[0];
    res &= UINT64_C(0x3ffffffff);
    return res;
}